

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O1

void henson_load_float(char *name,float *x)

{
  NameMap *this;
  allocator local_79;
  string local_78;
  data_t local_58;
  int local_20;
  
  this = namemap;
  if (namemap != (NameMap *)0x0) {
    std::__cxx11::string::string((string *)&local_78,name,&local_79);
    henson::NameMap::get((Value *)&local_58.head_,this,&local_78);
    if (local_20 != 3) {
      mpark::throw_bad_variant_access();
    }
    *x = (float)local_58.head_.value;
    mpark::detail::
    destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
    ::~destructor((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                   *)&local_58.head_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
henson_load_float(const char* name, float* x)
{
    if (!namemap) return;
    *x = henson::get<float>(namemap->get(name));
}